

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::QuadMvIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  undefined8 *puVar5;
  undefined1 (*pauVar6) [16];
  undefined4 uVar7;
  undefined4 uVar8;
  Scene *pSVar9;
  Geometry *pGVar10;
  RTCFilterFunctionN p_Var11;
  ulong uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined8 uVar15;
  undefined8 uVar16;
  uint uVar17;
  int iVar18;
  NodeRef *pNVar19;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  NodeRef *pNVar23;
  ulong uVar24;
  ulong uVar25;
  size_t sVar26;
  ulong uVar27;
  float fVar28;
  float fVar41;
  float fVar42;
  undefined1 auVar29 [16];
  float fVar43;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  float fVar44;
  float fVar60;
  float fVar61;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  float fVar62;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  float fVar63;
  float fVar70;
  float fVar71;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  float fVar72;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  float fVar82;
  float fVar83;
  float fVar87;
  float fVar88;
  float fVar89;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  float fVar90;
  float fVar92;
  undefined1 auVar91 [16];
  float fVar93;
  float fVar94;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  float fVar103;
  float fVar104;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  float fVar115;
  float fVar116;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  undefined1 auVar117 [16];
  float fVar126;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  float fVar127;
  float fVar128;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  float fVar137;
  float fVar140;
  float fVar141;
  float fVar142;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  NodeRef *local_bf0;
  undefined1 local_b98 [8];
  float fStack_b90;
  float fStack_b8c;
  undefined1 local_b78 [16];
  long local_b68;
  long local_b60;
  long local_b58;
  undefined1 (*local_b50) [16];
  RTCFilterFunctionNArguments args;
  undefined8 local_b18;
  undefined8 uStack_b10;
  undefined1 local_b08 [8];
  float fStack_b00;
  float fStack_afc;
  undefined8 local_a58;
  undefined8 uStack_a50;
  undefined8 local_a48;
  undefined8 uStack_a40;
  undefined8 local_a38;
  undefined8 uStack_a30;
  undefined8 local_a28;
  undefined8 uStack_a20;
  undefined8 local_a18;
  undefined8 uStack_a10;
  undefined1 local_a08 [12];
  float fStack_9fc;
  float local_9f8;
  float fStack_9f4;
  float fStack_9f0;
  float fStack_9ec;
  undefined1 local_9e8 [8];
  float fStack_9e0;
  float fStack_9dc;
  undefined1 local_9d8 [16];
  undefined1 local_9c8 [16];
  undefined1 local_9b8 [16];
  undefined1 local_9a8 [16];
  undefined1 local_998 [16];
  undefined1 local_988 [16];
  undefined1 local_978 [8];
  float fStack_970;
  float fStack_96c;
  undefined1 local_968 [16];
  undefined1 local_958 [16];
  undefined1 local_948 [16];
  undefined1 local_938 [16];
  undefined4 local_928;
  undefined4 uStack_924;
  undefined4 uStack_920;
  undefined4 uStack_91c;
  undefined1 local_918 [16];
  undefined1 local_908 [16];
  undefined4 local_8f8;
  undefined4 uStack_8f4;
  undefined4 uStack_8f0;
  undefined4 uStack_8ec;
  undefined1 local_8e8 [16];
  undefined4 local_8d8;
  undefined4 uStack_8d4;
  undefined4 uStack_8d0;
  undefined4 uStack_8cc;
  uint local_8c8;
  uint uStack_8c4;
  uint uStack_8c0;
  uint uStack_8bc;
  uint local_8b8;
  uint uStack_8b4;
  uint uStack_8b0;
  uint uStack_8ac;
  uint local_8a8;
  uint uStack_8a4;
  uint uStack_8a0;
  uint uStack_89c;
  int local_898;
  int iStack_894;
  int iStack_890;
  int iStack_88c;
  undefined1 local_888 [16];
  float local_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float local_868;
  float fStack_864;
  float fStack_860;
  float fStack_85c;
  float local_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float local_848;
  float fStack_844;
  float fStack_840;
  float fStack_83c;
  float local_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float local_828;
  float fStack_824;
  float fStack_820;
  float fStack_81c;
  float local_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float local_808;
  float fStack_804;
  float fStack_800;
  float fStack_7fc;
  float local_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  undefined1 local_7e8 [16];
  NodeRef stack [244];
  
  uVar16 = mm_lookupmask_ps._248_8_;
  uVar15 = mm_lookupmask_ps._240_8_;
  stack[0] = root;
  local_7f8 = *(float *)((long)&(tray->org).field_0 + k * 4);
  local_808 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_818 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_828 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_838 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  local_848 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_868 = local_828 * 0.99999964;
  local_878 = local_838 * 0.99999964;
  local_858 = local_848 * 0.99999964;
  local_828 = local_828 * 1.0000004;
  local_838 = local_838 * 1.0000004;
  local_848 = local_848 * 1.0000004;
  uVar25 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar22 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar27 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar18 = (tray->tnear).field_0.i[k];
  local_888._4_4_ = iVar18;
  local_888._0_4_ = iVar18;
  local_888._8_4_ = iVar18;
  local_888._12_4_ = iVar18;
  local_898 = (tray->tfar).field_0.i[k];
  local_7e8 = mm_lookupmask_ps._0_16_;
  local_b50 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_bf0 = stack + 1;
  iStack_894 = local_898;
  iStack_890 = local_898;
  iStack_88c = local_898;
  fStack_7f4 = local_7f8;
  fStack_7f0 = local_7f8;
  fStack_7ec = local_7f8;
  fStack_804 = local_808;
  fStack_800 = local_808;
  fStack_7fc = local_808;
  fStack_814 = local_818;
  fStack_810 = local_818;
  fStack_80c = local_818;
  fStack_824 = local_828;
  fStack_820 = local_828;
  fStack_81c = local_828;
  fStack_834 = local_838;
  fStack_830 = local_838;
  fStack_82c = local_838;
  fStack_844 = local_848;
  fStack_840 = local_848;
  fStack_83c = local_848;
  fStack_854 = local_858;
  fStack_850 = local_858;
  fStack_84c = local_858;
  fStack_864 = local_868;
  fStack_860 = local_868;
  fStack_85c = local_868;
  fStack_874 = local_878;
  fStack_870 = local_878;
  fStack_86c = local_878;
LAB_007120b9:
  do {
    pNVar23 = local_bf0;
    if (pNVar23 == stack) {
LAB_007133d9:
      return pNVar23 != stack;
    }
    pNVar19 = pNVar23 + -1;
    sVar26 = pNVar23[-1].ptr;
    local_bf0 = pNVar19;
    while ((sVar26 & 8) == 0) {
      pfVar1 = (float *)(sVar26 + 0x20 + uVar25);
      auVar47._0_4_ = (*pfVar1 - local_7f8) * local_868;
      auVar47._4_4_ = (pfVar1[1] - fStack_7f4) * fStack_864;
      auVar47._8_4_ = (pfVar1[2] - fStack_7f0) * fStack_860;
      auVar47._12_4_ = (pfVar1[3] - fStack_7ec) * fStack_85c;
      pfVar1 = (float *)(sVar26 + 0x20 + uVar22);
      auVar45._0_4_ = (*pfVar1 - local_808) * local_878;
      auVar45._4_4_ = (pfVar1[1] - fStack_804) * fStack_874;
      auVar45._8_4_ = (pfVar1[2] - fStack_800) * fStack_870;
      auVar45._12_4_ = (pfVar1[3] - fStack_7fc) * fStack_86c;
      auVar29 = maxps(auVar47,auVar45);
      pfVar1 = (float *)(sVar26 + 0x20 + uVar27);
      auVar46._0_4_ = (*pfVar1 - local_818) * local_858;
      auVar46._4_4_ = (pfVar1[1] - fStack_814) * fStack_854;
      auVar46._8_4_ = (pfVar1[2] - fStack_810) * fStack_850;
      auVar46._12_4_ = (pfVar1[3] - fStack_80c) * fStack_84c;
      auVar47 = maxps(auVar46,local_888);
      auVar47 = maxps(auVar29,auVar47);
      pfVar1 = (float *)(sVar26 + 0x20 + (uVar25 ^ 0x10));
      auVar48._0_4_ = (*pfVar1 - local_7f8) * local_828;
      auVar48._4_4_ = (pfVar1[1] - fStack_7f4) * fStack_824;
      auVar48._8_4_ = (pfVar1[2] - fStack_7f0) * fStack_820;
      auVar48._12_4_ = (pfVar1[3] - fStack_7ec) * fStack_81c;
      pfVar1 = (float *)(sVar26 + 0x20 + (uVar22 ^ 0x10));
      auVar64._0_4_ = (*pfVar1 - local_808) * local_838;
      auVar64._4_4_ = (pfVar1[1] - fStack_804) * fStack_834;
      auVar64._8_4_ = (pfVar1[2] - fStack_800) * fStack_830;
      auVar64._12_4_ = (pfVar1[3] - fStack_7fc) * fStack_82c;
      auVar49 = minps(auVar48,auVar64);
      pfVar1 = (float *)(sVar26 + 0x20 + (uVar27 ^ 0x10));
      auVar65._0_4_ = (*pfVar1 - local_818) * local_848;
      auVar65._4_4_ = (pfVar1[1] - fStack_814) * fStack_844;
      auVar65._8_4_ = (pfVar1[2] - fStack_810) * fStack_840;
      auVar65._12_4_ = (pfVar1[3] - fStack_80c) * fStack_83c;
      auVar29._4_4_ = iStack_894;
      auVar29._0_4_ = local_898;
      auVar29._8_4_ = iStack_890;
      auVar29._12_4_ = iStack_88c;
      auVar29 = minps(auVar65,auVar29);
      auVar29 = minps(auVar49,auVar29);
      auVar49._4_4_ = -(uint)(auVar47._4_4_ <= auVar29._4_4_);
      auVar49._0_4_ = -(uint)(auVar47._0_4_ <= auVar29._0_4_);
      auVar49._8_4_ = -(uint)(auVar47._8_4_ <= auVar29._8_4_);
      auVar49._12_4_ = -(uint)(auVar47._12_4_ <= auVar29._12_4_);
      uVar17 = movmskps((int)pNVar19,auVar49);
      if (uVar17 == 0) goto LAB_007120b9;
      uVar17 = uVar17 & 0xff;
      pNVar19 = (NodeRef *)(sVar26 & 0xfffffffffffffff0);
      lVar20 = 0;
      if (uVar17 != 0) {
        for (; (uVar17 >> lVar20 & 1) == 0; lVar20 = lVar20 + 1) {
        }
      }
      sVar26 = pNVar19[lVar20].ptr;
      uVar17 = uVar17 - 1 & uVar17;
      uVar24 = (ulong)uVar17;
      if (uVar17 != 0) {
        do {
          local_bf0->ptr = sVar26;
          local_bf0 = local_bf0 + 1;
          lVar20 = 0;
          if (uVar24 != 0) {
            for (; (uVar24 >> lVar20 & 1) == 0; lVar20 = lVar20 + 1) {
            }
          }
          sVar26 = pNVar19[lVar20].ptr;
          uVar24 = uVar24 - 1 & uVar24;
        } while (uVar24 != 0);
      }
    }
    local_b60 = (ulong)((uint)sVar26 & 0xf) - 8;
    uVar24 = sVar26 & 0xfffffffffffffff0;
    local_b58 = 0;
    while (local_b58 != local_b60) {
      lVar20 = local_b58 * 0xe0;
      puVar5 = (undefined8 *)(uVar24 + 0xd0 + lVar20);
      local_a18 = *puVar5;
      uStack_a10 = puVar5[1];
      fVar114 = *(float *)(ray + k * 4);
      fVar72 = *(float *)(ray + k * 4 + 0x10);
      fVar62 = *(float *)(ray + k * 4 + 0x20);
      pfVar1 = (float *)(uVar24 + lVar20);
      pfVar2 = (float *)(uVar24 + 0x10 + lVar20);
      pfVar3 = (float *)(uVar24 + 0x20 + lVar20);
      pfVar4 = (float *)(uVar24 + 0x30 + lVar20);
      local_a28 = *(undefined8 *)pfVar4;
      uStack_a20 = *(undefined8 *)(pfVar4 + 2);
      fVar93 = *pfVar1 - fVar114;
      fVar97 = pfVar1[1] - fVar114;
      fVar99 = pfVar1[2] - fVar114;
      fVar101 = pfVar1[3] - fVar114;
      fVar137 = *pfVar2 - fVar72;
      fVar140 = pfVar2[1] - fVar72;
      fVar141 = pfVar2[2] - fVar72;
      fVar142 = pfVar2[3] - fVar72;
      fVar143 = *pfVar3 - fVar62;
      fVar145 = pfVar3[1] - fVar62;
      fVar147 = pfVar3[2] - fVar62;
      fVar149 = pfVar3[3] - fVar62;
      fVar103 = *pfVar4 - fVar114;
      fVar109 = pfVar4[1] - fVar114;
      fVar111 = pfVar4[2] - fVar114;
      fVar113 = pfVar4[3] - fVar114;
      pfVar1 = (float *)(uVar24 + 0x40 + lVar20);
      local_a48 = *(undefined8 *)pfVar1;
      uStack_a40 = *(undefined8 *)(pfVar1 + 2);
      fVar82 = *pfVar1 - fVar72;
      fVar87 = pfVar1[1] - fVar72;
      fVar88 = pfVar1[2] - fVar72;
      fVar89 = pfVar1[3] - fVar72;
      pfVar1 = (float *)(uVar24 + 0x50 + lVar20);
      local_a38 = *(undefined8 *)pfVar1;
      uStack_a30 = *(undefined8 *)(pfVar1 + 2);
      fVar73 = *pfVar1 - fVar62;
      fVar74 = pfVar1[1] - fVar62;
      fVar75 = pfVar1[2] - fVar62;
      fVar76 = pfVar1[3] - fVar62;
      pfVar1 = (float *)(uVar24 + 0x90 + lVar20);
      local_b18 = *(undefined8 *)pfVar1;
      uStack_b10 = *(undefined8 *)(pfVar1 + 2);
      fVar104 = *pfVar1 - fVar114;
      fVar110 = pfVar1[1] - fVar114;
      fVar112 = pfVar1[2] - fVar114;
      fVar114 = pfVar1[3] - fVar114;
      pfVar1 = (float *)(uVar24 + 0xa0 + lVar20);
      local_a58 = *(undefined8 *)pfVar1;
      uStack_a50 = *(undefined8 *)(pfVar1 + 2);
      fVar63 = *pfVar1 - fVar72;
      fVar70 = pfVar1[1] - fVar72;
      fVar71 = pfVar1[2] - fVar72;
      fVar72 = pfVar1[3] - fVar72;
      pauVar6 = (undefined1 (*) [16])(uVar24 + 0xb0 + lVar20);
      _local_b98 = *pauVar6;
      fVar44 = *(float *)*pauVar6 - fVar62;
      fVar60 = *(float *)(*pauVar6 + 4) - fVar62;
      fVar61 = *(float *)(*pauVar6 + 8) - fVar62;
      fVar62 = *(float *)(*pauVar6 + 0xc) - fVar62;
      fVar127 = fVar104 - fVar93;
      fVar131 = fVar110 - fVar97;
      fVar133 = fVar112 - fVar99;
      fVar135 = fVar114 - fVar101;
      fVar158 = fVar63 - fVar137;
      fVar159 = fVar70 - fVar140;
      fVar160 = fVar71 - fVar141;
      fVar161 = fVar72 - fVar142;
      fVar151 = fVar44 - fVar143;
      fVar154 = fVar60 - fVar145;
      fVar155 = fVar61 - fVar147;
      fVar157 = fVar62 - fVar149;
      fVar126 = *(float *)(ray + k * 4 + 0x50);
      fVar156 = *(float *)(ray + k * 4 + 0x60);
      fVar83 = *(float *)(ray + k * 4 + 0x40);
      fVar90 = (fVar158 * (fVar143 + fVar44) - (fVar137 + fVar63) * fVar151) * fVar83 +
               ((fVar93 + fVar104) * fVar151 - (fVar143 + fVar44) * fVar127) * fVar126 +
               (fVar127 * (fVar137 + fVar63) - (fVar93 + fVar104) * fVar158) * fVar156;
      fVar92 = (fVar159 * (fVar145 + fVar60) - (fVar140 + fVar70) * fVar154) * fVar83 +
               ((fVar97 + fVar110) * fVar154 - (fVar145 + fVar60) * fVar131) * fVar126 +
               (fVar131 * (fVar140 + fVar70) - (fVar97 + fVar110) * fVar159) * fVar156;
      local_a08._0_8_ = CONCAT44(fVar92,fVar90);
      local_a08._8_4_ =
           (fVar160 * (fVar147 + fVar61) - (fVar141 + fVar71) * fVar155) * fVar83 +
           ((fVar99 + fVar112) * fVar155 - (fVar147 + fVar61) * fVar133) * fVar126 +
           (fVar133 * (fVar141 + fVar71) - (fVar99 + fVar112) * fVar160) * fVar156;
      fStack_9fc = (fVar161 * (fVar149 + fVar62) - (fVar142 + fVar72) * fVar157) * fVar83 +
                   ((fVar101 + fVar114) * fVar157 - (fVar149 + fVar62) * fVar135) * fVar126 +
                   (fVar135 * (fVar142 + fVar72) - (fVar101 + fVar114) * fVar161) * fVar156;
      fVar128 = fVar93 - fVar103;
      fVar132 = fVar97 - fVar109;
      fVar134 = fVar99 - fVar111;
      fVar136 = fVar101 - fVar113;
      fVar115 = fVar137 - fVar82;
      fVar120 = fVar140 - fVar87;
      fVar122 = fVar141 - fVar88;
      fVar124 = fVar142 - fVar89;
      fVar28 = fVar143 - fVar73;
      fVar41 = fVar145 - fVar74;
      fVar42 = fVar147 - fVar75;
      fVar43 = fVar149 - fVar76;
      auVar84._0_4_ =
           (fVar115 * (fVar143 + fVar73) - (fVar137 + fVar82) * fVar28) * fVar83 +
           ((fVar93 + fVar103) * fVar28 - (fVar143 + fVar73) * fVar128) * fVar126 +
           (fVar128 * (fVar137 + fVar82) - (fVar93 + fVar103) * fVar115) * fVar156;
      auVar84._4_4_ =
           (fVar120 * (fVar145 + fVar74) - (fVar140 + fVar87) * fVar41) * fVar83 +
           ((fVar97 + fVar109) * fVar41 - (fVar145 + fVar74) * fVar132) * fVar126 +
           (fVar132 * (fVar140 + fVar87) - (fVar97 + fVar109) * fVar120) * fVar156;
      auVar84._8_4_ =
           (fVar122 * (fVar147 + fVar75) - (fVar141 + fVar88) * fVar42) * fVar83 +
           ((fVar99 + fVar111) * fVar42 - (fVar147 + fVar75) * fVar134) * fVar126 +
           (fVar134 * (fVar141 + fVar88) - (fVar99 + fVar111) * fVar122) * fVar156;
      auVar84._12_4_ =
           (fVar124 * (fVar149 + fVar76) - (fVar142 + fVar89) * fVar43) * fVar83 +
           ((fVar101 + fVar113) * fVar43 - (fVar149 + fVar76) * fVar136) * fVar126 +
           (fVar136 * (fVar142 + fVar89) - (fVar101 + fVar113) * fVar124) * fVar156;
      fVar116 = fVar103 - fVar104;
      fVar121 = fVar109 - fVar110;
      fVar123 = fVar111 - fVar112;
      fVar125 = fVar113 - fVar114;
      fVar144 = fVar82 - fVar63;
      fVar146 = fVar87 - fVar70;
      fVar148 = fVar88 - fVar71;
      fVar150 = fVar89 - fVar72;
      fVar94 = fVar73 - fVar44;
      fVar98 = fVar74 - fVar60;
      fVar100 = fVar75 - fVar61;
      fVar102 = fVar76 - fVar62;
      auVar138._0_4_ =
           (fVar144 * (fVar44 + fVar73) - (fVar63 + fVar82) * fVar94) * fVar83 +
           ((fVar104 + fVar103) * fVar94 - (fVar44 + fVar73) * fVar116) * fVar126 +
           (fVar116 * (fVar63 + fVar82) - (fVar104 + fVar103) * fVar144) * fVar156;
      auVar138._4_4_ =
           (fVar146 * (fVar60 + fVar74) - (fVar70 + fVar87) * fVar98) * fVar83 +
           ((fVar110 + fVar109) * fVar98 - (fVar60 + fVar74) * fVar121) * fVar126 +
           (fVar121 * (fVar70 + fVar87) - (fVar110 + fVar109) * fVar146) * fVar156;
      auVar138._8_4_ =
           (fVar148 * (fVar61 + fVar75) - (fVar71 + fVar88) * fVar100) * fVar83 +
           ((fVar112 + fVar111) * fVar100 - (fVar61 + fVar75) * fVar123) * fVar126 +
           (fVar123 * (fVar71 + fVar88) - (fVar112 + fVar111) * fVar148) * fVar156;
      auVar138._12_4_ =
           (fVar150 * (fVar62 + fVar76) - (fVar72 + fVar89) * fVar102) * fVar83 +
           ((fVar114 + fVar113) * fVar102 - (fVar62 + fVar76) * fVar125) * fVar126 +
           (fVar125 * (fVar72 + fVar89) - (fVar114 + fVar113) * fVar150) * fVar156;
      local_9e8._0_4_ = auVar84._0_4_ + fVar90 + auVar138._0_4_;
      local_9e8._4_4_ = auVar84._4_4_ + fVar92 + auVar138._4_4_;
      fStack_9e0 = auVar84._8_4_ + (float)local_a08._8_4_ + auVar138._8_4_;
      fStack_9dc = auVar84._12_4_ + fStack_9fc + auVar138._12_4_;
      auVar30._8_4_ = local_a08._8_4_;
      auVar30._0_8_ = local_a08._0_8_;
      auVar30._12_4_ = fStack_9fc;
      auVar29 = minps(auVar30,auVar84);
      auVar29 = minps(auVar29,auVar138);
      auVar105._8_4_ = local_a08._8_4_;
      auVar105._0_8_ = local_a08._0_8_;
      auVar105._12_4_ = fStack_9fc;
      auVar47 = maxps(auVar105,auVar84);
      auVar47 = maxps(auVar47,auVar138);
      fVar114 = ABS((float)local_9e8._0_4_) * 1.1920929e-07;
      fVar72 = ABS((float)local_9e8._4_4_) * 1.1920929e-07;
      fVar62 = ABS(fStack_9e0) * 1.1920929e-07;
      fVar44 = ABS(fStack_9dc) * 1.1920929e-07;
      auVar106._4_4_ = -(uint)(auVar47._4_4_ <= fVar72);
      auVar106._0_4_ = -(uint)(auVar47._0_4_ <= fVar114);
      auVar106._8_4_ = -(uint)(auVar47._8_4_ <= fVar62);
      auVar106._12_4_ = -(uint)(auVar47._12_4_ <= fVar44);
      auVar31._4_4_ = -(uint)(-fVar72 <= auVar29._4_4_);
      auVar31._0_4_ = -(uint)(-fVar114 <= auVar29._0_4_);
      auVar31._8_4_ = -(uint)(-fVar62 <= auVar29._8_4_);
      auVar31._12_4_ = -(uint)(-fVar44 <= auVar29._12_4_);
      auVar106 = auVar106 | auVar31;
      local_b68 = uVar24 + lVar20;
      iVar18 = movmskps((int)lVar20,auVar106);
      if (iVar18 != 0) {
        auVar85._0_4_ = fVar158 * fVar28 - fVar115 * fVar151;
        auVar85._4_4_ = fVar159 * fVar41 - fVar120 * fVar154;
        auVar85._8_4_ = fVar160 * fVar42 - fVar122 * fVar155;
        auVar85._12_4_ = fVar161 * fVar43 - fVar124 * fVar157;
        auVar129._0_4_ = fVar115 * fVar94 - fVar28 * fVar144;
        auVar129._4_4_ = fVar120 * fVar98 - fVar41 * fVar146;
        auVar129._8_4_ = fVar122 * fVar100 - fVar42 * fVar148;
        auVar129._12_4_ = fVar124 * fVar102 - fVar43 * fVar150;
        auVar32._4_4_ = -(uint)(ABS(fVar120 * fVar154) < ABS(fVar41 * fVar146));
        auVar32._0_4_ = -(uint)(ABS(fVar115 * fVar151) < ABS(fVar28 * fVar144));
        auVar32._8_4_ = -(uint)(ABS(fVar122 * fVar155) < ABS(fVar42 * fVar148));
        auVar32._12_4_ = -(uint)(ABS(fVar124 * fVar157) < ABS(fVar43 * fVar150));
        local_9d8 = blendvps(auVar129,auVar85,auVar32);
        auVar117._0_4_ = fVar151 * fVar128 - fVar28 * fVar127;
        auVar117._4_4_ = fVar154 * fVar132 - fVar41 * fVar131;
        auVar117._8_4_ = fVar155 * fVar134 - fVar42 * fVar133;
        auVar117._12_4_ = fVar157 * fVar136 - fVar43 * fVar135;
        auVar77._0_4_ = fVar28 * fVar116 - fVar128 * fVar94;
        auVar77._4_4_ = fVar41 * fVar121 - fVar132 * fVar98;
        auVar77._8_4_ = fVar42 * fVar123 - fVar134 * fVar100;
        auVar77._12_4_ = fVar43 * fVar125 - fVar136 * fVar102;
        auVar33._4_4_ = -(uint)(ABS(fVar41 * fVar131) < ABS(fVar132 * fVar98));
        auVar33._0_4_ = -(uint)(ABS(fVar28 * fVar127) < ABS(fVar128 * fVar94));
        auVar33._8_4_ = -(uint)(ABS(fVar42 * fVar133) < ABS(fVar134 * fVar100));
        auVar33._12_4_ = -(uint)(ABS(fVar43 * fVar135) < ABS(fVar136 * fVar102));
        local_9c8 = blendvps(auVar77,auVar117,auVar33);
        auVar95._0_4_ = fVar127 * fVar115 - fVar128 * fVar158;
        auVar95._4_4_ = fVar131 * fVar120 - fVar132 * fVar159;
        auVar95._8_4_ = fVar133 * fVar122 - fVar134 * fVar160;
        auVar95._12_4_ = fVar135 * fVar124 - fVar136 * fVar161;
        auVar80._0_4_ = fVar128 * fVar144 - fVar115 * fVar116;
        auVar80._4_4_ = fVar132 * fVar146 - fVar120 * fVar121;
        auVar80._8_4_ = fVar134 * fVar148 - fVar122 * fVar123;
        auVar80._12_4_ = fVar136 * fVar150 - fVar124 * fVar125;
        auVar34._4_4_ = -(uint)(ABS(fVar132 * fVar159) < ABS(fVar120 * fVar121));
        auVar34._0_4_ = -(uint)(ABS(fVar128 * fVar158) < ABS(fVar115 * fVar116));
        auVar34._8_4_ = -(uint)(ABS(fVar134 * fVar160) < ABS(fVar122 * fVar123));
        auVar34._12_4_ = -(uint)(ABS(fVar136 * fVar161) < ABS(fVar124 * fVar125));
        local_9b8 = blendvps(auVar80,auVar95,auVar34);
        fVar114 = fVar83 * local_9d8._0_4_ + fVar126 * local_9c8._0_4_ + fVar156 * local_9b8._0_4_;
        fVar72 = fVar83 * local_9d8._4_4_ + fVar126 * local_9c8._4_4_ + fVar156 * local_9b8._4_4_;
        fVar62 = fVar83 * local_9d8._8_4_ + fVar126 * local_9c8._8_4_ + fVar156 * local_9b8._8_4_;
        fVar126 = fVar83 * local_9d8._12_4_ +
                  fVar126 * local_9c8._12_4_ + fVar156 * local_9b8._12_4_;
        auVar118._0_4_ = fVar114 + fVar114;
        auVar118._4_4_ = fVar72 + fVar72;
        auVar118._8_4_ = fVar62 + fVar62;
        auVar118._12_4_ = fVar126 + fVar126;
        auVar50._0_4_ = fVar143 * local_9b8._0_4_;
        auVar50._4_4_ = fVar145 * local_9b8._4_4_;
        auVar50._8_4_ = fVar147 * local_9b8._8_4_;
        auVar50._12_4_ = fVar149 * local_9b8._12_4_;
        fVar42 = fVar93 * local_9d8._0_4_ + fVar137 * local_9c8._0_4_ + auVar50._0_4_;
        fVar43 = fVar97 * local_9d8._4_4_ + fVar140 * local_9c8._4_4_ + auVar50._4_4_;
        fVar44 = fVar99 * local_9d8._8_4_ + fVar141 * local_9c8._8_4_ + auVar50._8_4_;
        fVar60 = fVar101 * local_9d8._12_4_ + fVar142 * local_9c8._12_4_ + auVar50._12_4_;
        auVar29 = rcpps(auVar50,auVar118);
        fVar114 = auVar29._0_4_;
        fVar72 = auVar29._4_4_;
        fVar126 = auVar29._8_4_;
        fVar156 = auVar29._12_4_;
        fVar83 = (float)DAT_01f46a60;
        fVar28 = DAT_01f46a60._4_4_;
        fVar41 = DAT_01f46a60._12_4_;
        fVar62 = DAT_01f46a60._8_4_;
        local_978._0_4_ =
             ((fVar83 - auVar118._0_4_ * fVar114) * fVar114 + fVar114) * (fVar42 + fVar42);
        local_978._4_4_ = ((fVar28 - auVar118._4_4_ * fVar72) * fVar72 + fVar72) * (fVar43 + fVar43)
        ;
        fStack_970 = ((fVar62 - auVar118._8_4_ * fVar126) * fVar126 + fVar126) * (fVar44 + fVar44);
        fStack_96c = ((fVar41 - auVar118._12_4_ * fVar156) * fVar156 + fVar156) * (fVar60 + fVar60);
        fVar114 = *(float *)(ray + k * 4 + 0x80);
        fVar72 = *(float *)(ray + k * 4 + 0x30);
        auVar66._4_4_ = -(uint)(fVar72 <= (float)local_978._4_4_);
        auVar66._0_4_ = -(uint)(fVar72 <= (float)local_978._0_4_);
        auVar66._8_4_ = -(uint)(fVar72 <= fStack_970);
        auVar66._12_4_ = -(uint)(fVar72 <= fStack_96c);
        auVar51._0_4_ =
             -(uint)((float)local_978._0_4_ <= fVar114 && fVar72 <= (float)local_978._0_4_) &
             auVar106._0_4_;
        auVar51._4_4_ =
             -(uint)((float)local_978._4_4_ <= fVar114 && fVar72 <= (float)local_978._4_4_) &
             auVar106._4_4_;
        auVar51._8_4_ = -(uint)(fStack_970 <= fVar114 && fVar72 <= fStack_970) & auVar106._8_4_;
        auVar51._12_4_ = -(uint)(fStack_96c <= fVar114 && fVar72 <= fStack_96c) & auVar106._12_4_;
        iVar18 = movmskps(iVar18,auVar51);
        if (iVar18 != 0) {
          local_9a8._0_4_ = auVar51._0_4_ & -(uint)(auVar118._0_4_ != 0.0);
          local_9a8._4_4_ = auVar51._4_4_ & -(uint)(auVar118._4_4_ != 0.0);
          local_9a8._8_4_ = auVar51._8_4_ & -(uint)(auVar118._8_4_ != 0.0);
          local_9a8._12_4_ = auVar51._12_4_ & -(uint)(auVar118._12_4_ != 0.0);
          iVar18 = movmskps(iVar18,local_9a8);
          if (iVar18 != 0) {
            local_9f8 = auVar84._0_4_;
            fStack_9f4 = auVar84._4_4_;
            fStack_9f0 = auVar84._8_4_;
            fStack_9ec = auVar84._12_4_;
            local_938 = local_7e8;
            pSVar9 = context->scene;
            auVar13._4_4_ = local_9e8._4_4_;
            auVar13._0_4_ = local_9e8._0_4_;
            auVar13._8_4_ = fStack_9e0;
            auVar13._12_4_ = fStack_9dc;
            auVar29 = rcpps(auVar66,auVar13);
            fVar72 = auVar29._0_4_;
            fVar126 = auVar29._4_4_;
            fVar156 = auVar29._8_4_;
            fVar42 = auVar29._12_4_;
            fVar72 = (float)(-(uint)(1e-18 <= ABS((float)local_9e8._0_4_)) &
                            (uint)((fVar83 - (float)local_9e8._0_4_ * fVar72) * fVar72 + fVar72));
            fVar126 = (float)(-(uint)(1e-18 <= ABS((float)local_9e8._4_4_)) &
                             (uint)((fVar28 - (float)local_9e8._4_4_ * fVar126) * fVar126 + fVar126)
                             );
            fVar156 = (float)(-(uint)(1e-18 <= ABS(fStack_9e0)) &
                             (uint)((fVar62 - fStack_9e0 * fVar156) * fVar156 + fVar156));
            fVar42 = (float)(-(uint)(1e-18 <= ABS(fStack_9dc)) &
                            (uint)((fVar41 - fStack_9dc * fVar42) * fVar42 + fVar42));
            auVar91._0_4_ = fVar90 * fVar72;
            auVar91._4_4_ = fVar92 * fVar126;
            auVar91._8_4_ = (float)local_a08._8_4_ * fVar156;
            auVar91._12_4_ = fStack_9fc * fVar42;
            auVar29 = minps(auVar91,_DAT_01f46a60);
            auVar152._0_4_ = fVar72 * auVar84._0_4_;
            auVar152._4_4_ = fVar126 * auVar84._4_4_;
            auVar152._8_4_ = fVar156 * auVar84._8_4_;
            auVar152._12_4_ = fVar42 * auVar84._12_4_;
            auVar47 = minps(auVar152,_DAT_01f46a60);
            auVar52._0_4_ = fVar83 - auVar29._0_4_;
            auVar52._4_4_ = fVar28 - auVar29._4_4_;
            auVar52._8_4_ = fVar62 - auVar29._8_4_;
            auVar52._12_4_ = fVar41 - auVar29._12_4_;
            auVar67._0_4_ = fVar83 - auVar47._0_4_;
            auVar67._4_4_ = fVar28 - auVar47._4_4_;
            auVar67._8_4_ = fVar62 - auVar47._8_4_;
            auVar67._12_4_ = fVar41 - auVar47._12_4_;
            local_998 = blendvps(auVar29,auVar52,local_7e8);
            local_988 = blendvps(auVar47,auVar67,local_7e8);
            local_968 = local_9d8;
            local_958 = local_9c8;
            local_948 = local_9b8;
            uVar21 = (ulong)(byte)iVar18;
            do {
              uVar12 = 0;
              if (uVar21 != 0) {
                for (; (uVar21 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
                }
              }
              local_8c8 = *(uint *)(local_b68 + 0xc0 + uVar12 * 4);
              pGVar10 = (pSVar9->geometries).items[local_8c8].ptr;
              if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar10->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_007133bd;
                local_8f8 = *(undefined4 *)(local_998 + uVar12 * 4);
                uVar7 = *(undefined4 *)(local_988 + uVar12 * 4);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_978 + uVar12 * 4);
                args.context = context->user;
                local_8d8 = *(undefined4 *)((long)&local_a18 + uVar12 * 4);
                local_8e8._4_4_ = uVar7;
                local_8e8._0_4_ = uVar7;
                local_8e8._8_4_ = uVar7;
                local_8e8._12_4_ = uVar7;
                local_928 = *(undefined4 *)(local_968 + uVar12 * 4);
                uVar7 = *(undefined4 *)(local_958 + uVar12 * 4);
                uVar8 = *(undefined4 *)(local_948 + uVar12 * 4);
                local_918._4_4_ = uVar7;
                local_918._0_4_ = uVar7;
                local_918._8_4_ = uVar7;
                local_918._12_4_ = uVar7;
                local_908._4_4_ = uVar8;
                local_908._0_4_ = uVar8;
                local_908._8_4_ = uVar8;
                local_908._12_4_ = uVar8;
                uStack_924 = local_928;
                uStack_920 = local_928;
                uStack_91c = local_928;
                uStack_8f4 = local_8f8;
                uStack_8f0 = local_8f8;
                uStack_8ec = local_8f8;
                uStack_8d4 = local_8d8;
                uStack_8d0 = local_8d8;
                uStack_8cc = local_8d8;
                uStack_8c4 = local_8c8;
                uStack_8c0 = local_8c8;
                uStack_8bc = local_8c8;
                local_8b8 = (args.context)->instID[0];
                uStack_8b4 = local_8b8;
                uStack_8b0 = local_8b8;
                uStack_8ac = local_8b8;
                local_8a8 = (args.context)->instPrimID[0];
                uStack_8a4 = local_8a8;
                uStack_8a0 = local_8a8;
                uStack_89c = local_8a8;
                local_b78 = *local_b50;
                args.valid = (int *)local_b78;
                args.geometryUserPtr = pGVar10->userPtr;
                args.hit = (RTCHitN *)&local_928;
                args.N = 4;
                args.ray = (RTCRayN *)ray;
                if (pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  (*pGVar10->occlusionFilterN)(&args);
                }
                if (local_b78 == (undefined1  [16])0x0) {
                  auVar53._8_4_ = 0xffffffff;
                  auVar53._0_8_ = 0xffffffffffffffff;
                  auVar53._12_4_ = 0xffffffff;
                  auVar53 = auVar53 ^ _DAT_01f46b70;
                }
                else {
                  p_Var11 = context->args->filter;
                  if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar10->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    (*p_Var11)(&args);
                  }
                  auVar35._0_4_ = -(uint)(local_b78._0_4_ == 0);
                  auVar35._4_4_ = -(uint)(local_b78._4_4_ == 0);
                  auVar35._8_4_ = -(uint)(local_b78._8_4_ == 0);
                  auVar35._12_4_ = -(uint)(local_b78._12_4_ == 0);
                  auVar53 = auVar35 ^ _DAT_01f46b70;
                  auVar29 = blendvps(_DAT_01f45a40,*(undefined1 (*) [16])(args.ray + 0x80),auVar35);
                  *(undefined1 (*) [16])(args.ray + 0x80) = auVar29;
                }
                if ((_DAT_01f46b40 & auVar53) != (undefined1  [16])0x0) goto LAB_007133bd;
                *(float *)(ray + k * 4 + 0x80) = fVar114;
              }
              uVar21 = uVar21 ^ 1L << (uVar12 & 0x3f);
            } while (uVar21 != 0);
            local_a28 = *(undefined8 *)(local_b68 + 0x30);
            uStack_a20 = *(undefined8 *)(local_b68 + 0x38);
            local_a48 = *(undefined8 *)(local_b68 + 0x40);
            uStack_a40 = *(undefined8 *)(local_b68 + 0x48);
            local_a38 = *(undefined8 *)(local_b68 + 0x50);
            uStack_a30 = *(undefined8 *)(local_b68 + 0x58);
            local_b18 = *(undefined8 *)(local_b68 + 0x90);
            uStack_b10 = *(undefined8 *)(local_b68 + 0x98);
            local_a58 = *(undefined8 *)(local_b68 + 0xa0);
            uStack_a50 = *(undefined8 *)(local_b68 + 0xa8);
            _local_b98 = *(undefined1 (*) [16])(local_b68 + 0xb0);
            iVar18 = 0;
          }
        }
      }
      fVar114 = *(float *)(ray + k * 4);
      fVar72 = *(float *)(ray + k * 4 + 0x10);
      fVar62 = *(float *)(ray + k * 4 + 0x20);
      fVar115 = *(float *)(local_b68 + 0x60) - fVar114;
      fVar116 = *(float *)(local_b68 + 100) - fVar114;
      fVar120 = *(float *)(local_b68 + 0x68) - fVar114;
      fVar121 = *(float *)(local_b68 + 0x6c) - fVar114;
      fVar127 = *(float *)(local_b68 + 0x70) - fVar72;
      fVar128 = *(float *)(local_b68 + 0x74) - fVar72;
      fVar131 = *(float *)(local_b68 + 0x78) - fVar72;
      fVar132 = *(float *)(local_b68 + 0x7c) - fVar72;
      fVar94 = *(float *)(local_b68 + 0x80) - fVar62;
      fVar97 = *(float *)(local_b68 + 0x84) - fVar62;
      fVar98 = *(float *)(local_b68 + 0x88) - fVar62;
      fVar99 = *(float *)(local_b68 + 0x8c) - fVar62;
      local_b18._0_4_ = (float)local_b18 - fVar114;
      local_b18._4_4_ = local_b18._4_4_ - fVar114;
      uStack_b10._0_4_ = (float)uStack_b10 - fVar114;
      uStack_b10._4_4_ = uStack_b10._4_4_ - fVar114;
      local_a58._0_4_ = (float)local_a58 - fVar72;
      local_a58._4_4_ = local_a58._4_4_ - fVar72;
      uStack_a50._0_4_ = (float)uStack_a50 - fVar72;
      uStack_a50._4_4_ = uStack_a50._4_4_ - fVar72;
      fVar126 = (float)local_b98._0_4_ - fVar62;
      fVar156 = (float)local_b98._4_4_ - fVar62;
      fStack_b90 = fStack_b90 - fVar62;
      fStack_b8c = fStack_b8c - fVar62;
      local_a28._0_4_ = (float)local_a28 - fVar114;
      local_a28._4_4_ = local_a28._4_4_ - fVar114;
      uStack_a20._0_4_ = (float)uStack_a20 - fVar114;
      uStack_a20._4_4_ = uStack_a20._4_4_ - fVar114;
      local_a48._0_4_ = (float)local_a48 - fVar72;
      local_a48._4_4_ = local_a48._4_4_ - fVar72;
      uStack_a40._0_4_ = (float)uStack_a40 - fVar72;
      uStack_a40._4_4_ = uStack_a40._4_4_ - fVar72;
      local_a38._0_4_ = (float)local_a38 - fVar62;
      local_a38._4_4_ = local_a38._4_4_ - fVar62;
      uStack_a30._0_4_ = (float)uStack_a30 - fVar62;
      uStack_a30._4_4_ = uStack_a30._4_4_ - fVar62;
      fVar71 = (float)local_a28 - fVar115;
      fVar75 = local_a28._4_4_ - fVar116;
      fVar87 = (float)uStack_a20 - fVar120;
      fVar90 = uStack_a20._4_4_ - fVar121;
      fVar133 = (float)local_a48 - fVar127;
      fVar134 = local_a48._4_4_ - fVar128;
      fVar135 = (float)uStack_a40 - fVar131;
      fVar136 = uStack_a40._4_4_ - fVar132;
      fVar110 = (float)local_a38 - fVar94;
      fVar111 = local_a38._4_4_ - fVar97;
      fVar112 = (float)uStack_a30 - fVar98;
      fVar113 = uStack_a30._4_4_ - fVar99;
      fVar114 = *(float *)(ray + k * 4 + 0x50);
      fVar72 = *(float *)(ray + k * 4 + 0x60);
      fVar62 = *(float *)(ray + k * 4 + 0x40);
      fVar100 = (fVar133 * (fVar94 + (float)local_a38) - (fVar127 + (float)local_a48) * fVar110) *
                fVar62 + ((fVar115 + (float)local_a28) * fVar110 -
                         (fVar94 + (float)local_a38) * fVar71) * fVar114 +
                         (fVar71 * (fVar127 + (float)local_a48) -
                         (fVar115 + (float)local_a28) * fVar133) * fVar72;
      fVar101 = (fVar134 * (fVar97 + local_a38._4_4_) - (fVar128 + local_a48._4_4_) * fVar111) *
                fVar62 + ((fVar116 + local_a28._4_4_) * fVar111 -
                         (fVar97 + local_a38._4_4_) * fVar75) * fVar114 +
                         (fVar75 * (fVar128 + local_a48._4_4_) -
                         (fVar116 + local_a28._4_4_) * fVar134) * fVar72;
      local_a08._0_8_ = CONCAT44(fVar101,fVar100);
      local_a08._8_4_ =
           (fVar135 * (fVar98 + (float)uStack_a30) - (fVar131 + (float)uStack_a40) * fVar112) *
           fVar62 + ((fVar120 + (float)uStack_a20) * fVar112 - (fVar98 + (float)uStack_a30) * fVar87
                    ) * fVar114 +
                    (fVar87 * (fVar131 + (float)uStack_a40) -
                    (fVar120 + (float)uStack_a20) * fVar135) * fVar72;
      fStack_9fc = (fVar136 * (fVar99 + uStack_a30._4_4_) - (fVar132 + uStack_a40._4_4_) * fVar113)
                   * fVar62 +
                   ((fVar121 + uStack_a20._4_4_) * fVar113 - (fVar99 + uStack_a30._4_4_) * fVar90) *
                   fVar114 + (fVar90 * (fVar132 + uStack_a40._4_4_) -
                             (fVar121 + uStack_a20._4_4_) * fVar136) * fVar72;
      fVar73 = fVar115 - (float)local_b18;
      fVar76 = fVar116 - local_b18._4_4_;
      fVar88 = fVar120 - (float)uStack_b10;
      fVar92 = fVar121 - uStack_b10._4_4_;
      fVar41 = fVar127 - (float)local_a58;
      fVar42 = fVar128 - local_a58._4_4_;
      fVar43 = fVar131 - (float)uStack_a50;
      fVar44 = fVar132 - uStack_a50._4_4_;
      fVar102 = fVar94 - fVar126;
      fVar103 = fVar97 - fVar156;
      fVar104 = fVar98 - fStack_b90;
      fVar109 = fVar99 - fStack_b8c;
      auVar78._0_4_ =
           (fVar41 * (fVar94 + fVar126) - (fVar127 + (float)local_a58) * fVar102) * fVar62 +
           ((fVar115 + (float)local_b18) * fVar102 - (fVar94 + fVar126) * fVar73) * fVar114 +
           (fVar73 * (fVar127 + (float)local_a58) - (fVar115 + (float)local_b18) * fVar41) * fVar72;
      auVar78._4_4_ =
           (fVar42 * (fVar97 + fVar156) - (fVar128 + local_a58._4_4_) * fVar103) * fVar62 +
           ((fVar116 + local_b18._4_4_) * fVar103 - (fVar97 + fVar156) * fVar76) * fVar114 +
           (fVar76 * (fVar128 + local_a58._4_4_) - (fVar116 + local_b18._4_4_) * fVar42) * fVar72;
      auVar78._8_4_ =
           (fVar43 * (fVar98 + fStack_b90) - (fVar131 + (float)uStack_a50) * fVar104) * fVar62 +
           ((fVar120 + (float)uStack_b10) * fVar104 - (fVar98 + fStack_b90) * fVar88) * fVar114 +
           (fVar88 * (fVar131 + (float)uStack_a50) - (fVar120 + (float)uStack_b10) * fVar43) *
           fVar72;
      auVar78._12_4_ =
           (fVar44 * (fVar99 + fStack_b8c) - (fVar132 + uStack_a50._4_4_) * fVar109) * fVar62 +
           ((fVar121 + uStack_b10._4_4_) * fVar109 - (fVar99 + fStack_b8c) * fVar92) * fVar114 +
           (fVar92 * (fVar132 + uStack_a50._4_4_) - (fVar121 + uStack_b10._4_4_) * fVar44) * fVar72;
      fVar60 = (float)local_b18 - (float)local_a28;
      fVar61 = local_b18._4_4_ - local_a28._4_4_;
      fVar63 = (float)uStack_b10 - (float)uStack_a20;
      fVar70 = uStack_b10._4_4_ - uStack_a20._4_4_;
      fVar74 = (float)local_a58 - (float)local_a48;
      fVar82 = local_a58._4_4_ - local_a48._4_4_;
      fVar89 = (float)uStack_a50 - (float)uStack_a40;
      fVar93 = uStack_a50._4_4_ - uStack_a40._4_4_;
      fVar122 = fVar126 - (float)local_a38;
      fVar123 = fVar156 - local_a38._4_4_;
      fVar124 = fStack_b90 - (float)uStack_a30;
      fVar125 = fStack_b8c - uStack_a30._4_4_;
      auVar36._0_4_ =
           (fVar74 * ((float)local_a38 + fVar126) - ((float)local_a48 + (float)local_a58) * fVar122)
           * fVar62 +
           (((float)local_a28 + (float)local_b18) * fVar122 - ((float)local_a38 + fVar126) * fVar60)
           * fVar114 +
           (fVar60 * ((float)local_a48 + (float)local_a58) -
           ((float)local_a28 + (float)local_b18) * fVar74) * fVar72;
      auVar36._4_4_ =
           (fVar82 * (local_a38._4_4_ + fVar156) - (local_a48._4_4_ + local_a58._4_4_) * fVar123) *
           fVar62 + ((local_a28._4_4_ + local_b18._4_4_) * fVar123 -
                    (local_a38._4_4_ + fVar156) * fVar61) * fVar114 +
                    (fVar61 * (local_a48._4_4_ + local_a58._4_4_) -
                    (local_a28._4_4_ + local_b18._4_4_) * fVar82) * fVar72;
      auVar36._8_4_ =
           (fVar89 * ((float)uStack_a30 + fStack_b90) -
           ((float)uStack_a40 + (float)uStack_a50) * fVar124) * fVar62 +
           (((float)uStack_a20 + (float)uStack_b10) * fVar124 -
           ((float)uStack_a30 + fStack_b90) * fVar63) * fVar114 +
           (fVar63 * ((float)uStack_a40 + (float)uStack_a50) -
           ((float)uStack_a20 + (float)uStack_b10) * fVar89) * fVar72;
      auVar36._12_4_ =
           (fVar93 * (uStack_a30._4_4_ + fStack_b8c) -
           (uStack_a40._4_4_ + uStack_a50._4_4_) * fVar125) * fVar62 +
           ((uStack_a20._4_4_ + uStack_b10._4_4_) * fVar125 -
           (uStack_a30._4_4_ + fStack_b8c) * fVar70) * fVar114 +
           (fVar70 * (uStack_a40._4_4_ + uStack_a50._4_4_) -
           (uStack_a20._4_4_ + uStack_b10._4_4_) * fVar93) * fVar72;
      local_b08._0_4_ = auVar78._0_4_ + fVar100 + auVar36._0_4_;
      local_b08._4_4_ = auVar78._4_4_ + fVar101 + auVar36._4_4_;
      fStack_b00 = auVar78._8_4_ + (float)local_a08._8_4_ + auVar36._8_4_;
      fStack_afc = auVar78._12_4_ + fStack_9fc + auVar36._12_4_;
      auVar54._8_4_ = local_a08._8_4_;
      auVar54._0_8_ = local_a08._0_8_;
      auVar54._12_4_ = fStack_9fc;
      auVar29 = minps(auVar54,auVar78);
      auVar29 = minps(auVar29,auVar36);
      auVar107._8_4_ = local_a08._8_4_;
      auVar107._0_8_ = local_a08._0_8_;
      auVar107._12_4_ = fStack_9fc;
      auVar47 = maxps(auVar107,auVar78);
      auVar47 = maxps(auVar47,auVar36);
      fVar126 = ABS((float)local_b08._0_4_) * 1.1920929e-07;
      fVar156 = ABS((float)local_b08._4_4_) * 1.1920929e-07;
      fVar83 = ABS(fStack_b00) * 1.1920929e-07;
      fVar28 = ABS(fStack_afc) * 1.1920929e-07;
      auVar108._4_4_ = -(uint)(auVar47._4_4_ <= fVar156);
      auVar108._0_4_ = -(uint)(auVar47._0_4_ <= fVar126);
      auVar108._8_4_ = -(uint)(auVar47._8_4_ <= fVar83);
      auVar108._12_4_ = -(uint)(auVar47._12_4_ <= fVar28);
      auVar55._4_4_ = -(uint)(-fVar156 <= auVar29._4_4_);
      auVar55._0_4_ = -(uint)(-fVar126 <= auVar29._0_4_);
      auVar55._8_4_ = -(uint)(-fVar83 <= auVar29._8_4_);
      auVar55._12_4_ = -(uint)(-fVar28 <= auVar29._12_4_);
      auVar108 = auVar108 | auVar55;
      iVar18 = movmskps(iVar18,auVar108);
      lVar20 = local_b58;
      if (iVar18 != 0) {
        auVar130._0_4_ = fVar133 * fVar102 - fVar41 * fVar110;
        auVar130._4_4_ = fVar134 * fVar103 - fVar42 * fVar111;
        auVar130._8_4_ = fVar135 * fVar104 - fVar43 * fVar112;
        auVar130._12_4_ = fVar136 * fVar109 - fVar44 * fVar113;
        auVar139._0_4_ = fVar41 * fVar122 - fVar102 * fVar74;
        auVar139._4_4_ = fVar42 * fVar123 - fVar103 * fVar82;
        auVar139._8_4_ = fVar43 * fVar124 - fVar104 * fVar89;
        auVar139._12_4_ = fVar44 * fVar125 - fVar109 * fVar93;
        auVar37._4_4_ = -(uint)(ABS(fVar42 * fVar111) < ABS(fVar103 * fVar82));
        auVar37._0_4_ = -(uint)(ABS(fVar41 * fVar110) < ABS(fVar102 * fVar74));
        auVar37._8_4_ = -(uint)(ABS(fVar43 * fVar112) < ABS(fVar104 * fVar89));
        auVar37._12_4_ = -(uint)(ABS(fVar44 * fVar113) < ABS(fVar109 * fVar93));
        local_9d8 = blendvps(auVar139,auVar130,auVar37);
        auVar81._0_4_ = fVar110 * fVar73 - fVar102 * fVar71;
        auVar81._4_4_ = fVar111 * fVar76 - fVar103 * fVar75;
        auVar81._8_4_ = fVar112 * fVar88 - fVar104 * fVar87;
        auVar81._12_4_ = fVar113 * fVar92 - fVar109 * fVar90;
        auVar86._0_4_ = fVar102 * fVar60 - fVar73 * fVar122;
        auVar86._4_4_ = fVar103 * fVar61 - fVar76 * fVar123;
        auVar86._8_4_ = fVar104 * fVar63 - fVar88 * fVar124;
        auVar86._12_4_ = fVar109 * fVar70 - fVar92 * fVar125;
        auVar38._4_4_ = -(uint)(ABS(fVar103 * fVar75) < ABS(fVar76 * fVar123));
        auVar38._0_4_ = -(uint)(ABS(fVar102 * fVar71) < ABS(fVar73 * fVar122));
        auVar38._8_4_ = -(uint)(ABS(fVar104 * fVar87) < ABS(fVar88 * fVar124));
        auVar38._12_4_ = -(uint)(ABS(fVar109 * fVar90) < ABS(fVar92 * fVar125));
        local_9c8 = blendvps(auVar86,auVar81,auVar38);
        auVar79._0_4_ = fVar71 * fVar41 - fVar73 * fVar133;
        auVar79._4_4_ = fVar75 * fVar42 - fVar76 * fVar134;
        auVar79._8_4_ = fVar87 * fVar43 - fVar88 * fVar135;
        auVar79._12_4_ = fVar90 * fVar44 - fVar92 * fVar136;
        auVar153._0_4_ = fVar73 * fVar74 - fVar41 * fVar60;
        auVar153._4_4_ = fVar76 * fVar82 - fVar42 * fVar61;
        auVar153._8_4_ = fVar88 * fVar89 - fVar43 * fVar63;
        auVar153._12_4_ = fVar92 * fVar93 - fVar44 * fVar70;
        auVar39._4_4_ = -(uint)(ABS(fVar76 * fVar134) < ABS(fVar42 * fVar61));
        auVar39._0_4_ = -(uint)(ABS(fVar73 * fVar133) < ABS(fVar41 * fVar60));
        fVar60 = (float)DAT_01f46a60;
        fVar61 = DAT_01f46a60._4_4_;
        fVar71 = DAT_01f46a60._12_4_;
        auVar39._8_4_ = -(uint)(ABS(fVar88 * fVar135) < ABS(fVar43 * fVar63));
        auVar39._12_4_ = -(uint)(ABS(fVar92 * fVar136) < ABS(fVar44 * fVar70));
        local_9b8 = blendvps(auVar153,auVar79,auVar39);
        fVar43 = fVar62 * local_9d8._0_4_ + fVar114 * local_9c8._0_4_ + fVar72 * local_9b8._0_4_;
        fVar44 = fVar62 * local_9d8._4_4_ + fVar114 * local_9c8._4_4_ + fVar72 * local_9b8._4_4_;
        fVar63 = fVar62 * local_9d8._8_4_ + fVar114 * local_9c8._8_4_ + fVar72 * local_9b8._8_4_;
        fVar70 = fVar62 * local_9d8._12_4_ + fVar114 * local_9c8._12_4_ + fVar72 * local_9b8._12_4_;
        fVar43 = fVar43 + fVar43;
        fVar44 = fVar44 + fVar44;
        fVar63 = fVar63 + fVar63;
        fVar70 = fVar70 + fVar70;
        auVar56._0_4_ = fVar94 * local_9b8._0_4_;
        auVar56._4_4_ = fVar97 * local_9b8._4_4_;
        auVar56._8_4_ = fVar98 * local_9b8._8_4_;
        auVar56._12_4_ = fVar99 * local_9b8._12_4_;
        fVar83 = fVar115 * local_9d8._0_4_ + fVar127 * local_9c8._0_4_ + auVar56._0_4_;
        fVar28 = fVar116 * local_9d8._4_4_ + fVar128 * local_9c8._4_4_ + auVar56._4_4_;
        fVar41 = fVar120 * local_9d8._8_4_ + fVar131 * local_9c8._8_4_ + auVar56._8_4_;
        fVar42 = fVar121 * local_9d8._12_4_ + fVar132 * local_9c8._12_4_ + auVar56._12_4_;
        auVar14._4_4_ = fVar44;
        auVar14._0_4_ = fVar43;
        auVar14._8_4_ = fVar63;
        auVar14._12_4_ = fVar70;
        auVar29 = rcpps(auVar56,auVar14);
        fVar114 = auVar29._0_4_;
        fVar72 = auVar29._4_4_;
        fVar126 = auVar29._8_4_;
        fVar156 = auVar29._12_4_;
        fVar62 = DAT_01f46a60._8_4_;
        local_978._0_4_ = ((fVar60 - fVar43 * fVar114) * fVar114 + fVar114) * (fVar83 + fVar83);
        local_978._4_4_ = ((fVar61 - fVar44 * fVar72) * fVar72 + fVar72) * (fVar28 + fVar28);
        fStack_970 = ((fVar62 - fVar63 * fVar126) * fVar126 + fVar126) * (fVar41 + fVar41);
        fStack_96c = ((fVar71 - fVar70 * fVar156) * fVar156 + fVar156) * (fVar42 + fVar42);
        fVar114 = *(float *)(ray + k * 4 + 0x80);
        fVar72 = *(float *)(ray + k * 4 + 0x30);
        auVar68._4_4_ = -(uint)(fVar72 <= (float)local_978._4_4_);
        auVar68._0_4_ = -(uint)(fVar72 <= (float)local_978._0_4_);
        auVar68._8_4_ = -(uint)(fVar72 <= fStack_970);
        auVar68._12_4_ = -(uint)(fVar72 <= fStack_96c);
        auVar57._0_4_ =
             -(uint)((float)local_978._0_4_ <= fVar114 && fVar72 <= (float)local_978._0_4_) &
             auVar108._0_4_;
        auVar57._4_4_ =
             -(uint)((float)local_978._4_4_ <= fVar114 && fVar72 <= (float)local_978._4_4_) &
             auVar108._4_4_;
        auVar57._8_4_ = -(uint)(fStack_970 <= fVar114 && fVar72 <= fStack_970) & auVar108._8_4_;
        auVar57._12_4_ = -(uint)(fStack_96c <= fVar114 && fVar72 <= fStack_96c) & auVar108._12_4_;
        iVar18 = movmskps(iVar18,auVar57);
        if (iVar18 != 0) {
          local_9a8._0_4_ = auVar57._0_4_ & -(uint)(fVar43 != 0.0);
          local_9a8._4_4_ = auVar57._4_4_ & -(uint)(fVar44 != 0.0);
          local_9a8._8_4_ = auVar57._8_4_ & -(uint)(fVar63 != 0.0);
          local_9a8._12_4_ = auVar57._12_4_ & -(uint)(fVar70 != 0.0);
          uVar17 = movmskps(iVar18,local_9a8);
          if (uVar17 != 0) {
            local_9f8 = auVar78._0_4_;
            fStack_9f4 = auVar78._4_4_;
            fStack_9f0 = auVar78._8_4_;
            fStack_9ec = auVar78._12_4_;
            _local_9e8 = _local_b08;
            local_938._8_8_ = uVar16;
            local_938._0_8_ = uVar15;
            pSVar9 = context->scene;
            auVar29 = rcpps(auVar68,_local_b08);
            fVar72 = auVar29._0_4_;
            fVar126 = auVar29._4_4_;
            fVar156 = auVar29._8_4_;
            fVar83 = auVar29._12_4_;
            fVar72 = (float)(-(uint)(1e-18 <= ABS((float)local_b08._0_4_)) &
                            (uint)((fVar60 - (float)local_b08._0_4_ * fVar72) * fVar72 + fVar72));
            fVar126 = (float)(-(uint)(1e-18 <= ABS((float)local_b08._4_4_)) &
                             (uint)((fVar61 - (float)local_b08._4_4_ * fVar126) * fVar126 + fVar126)
                             );
            fVar156 = (float)(-(uint)(1e-18 <= ABS(fStack_b00)) &
                             (uint)((fVar62 - fStack_b00 * fVar156) * fVar156 + fVar156));
            fVar83 = (float)(-(uint)(1e-18 <= ABS(fStack_afc)) &
                            (uint)((fVar71 - fStack_afc * fVar83) * fVar83 + fVar83));
            auVar119._0_4_ = fVar100 * fVar72;
            auVar119._4_4_ = fVar101 * fVar126;
            auVar119._8_4_ = (float)local_a08._8_4_ * fVar156;
            auVar119._12_4_ = fStack_9fc * fVar83;
            auVar47 = minps(auVar119,_DAT_01f46a60);
            auVar96._0_4_ = fVar72 * auVar78._0_4_;
            auVar96._4_4_ = fVar126 * auVar78._4_4_;
            auVar96._8_4_ = fVar156 * auVar78._8_4_;
            auVar96._12_4_ = fVar83 * auVar78._12_4_;
            auVar29 = minps(auVar96,_DAT_01f46a60);
            auVar58._0_4_ = fVar60 - auVar47._0_4_;
            auVar58._4_4_ = fVar61 - auVar47._4_4_;
            auVar58._8_4_ = fVar62 - auVar47._8_4_;
            auVar58._12_4_ = fVar71 - auVar47._12_4_;
            auVar69._0_4_ = fVar60 - auVar29._0_4_;
            auVar69._4_4_ = fVar61 - auVar29._4_4_;
            auVar69._8_4_ = fVar62 - auVar29._8_4_;
            auVar69._12_4_ = fVar71 - auVar29._12_4_;
            local_998 = blendvps(auVar47,auVar58,local_938);
            local_988 = blendvps(auVar29,auVar69,local_938);
            local_968 = local_9d8;
            local_958 = local_9c8;
            local_948 = local_9b8;
            uVar21 = (ulong)(uVar17 & 0xff);
            do {
              uVar12 = 0;
              if (uVar21 != 0) {
                for (; (uVar21 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
                }
              }
              local_8c8 = *(uint *)(local_b68 + 0xc0 + uVar12 * 4);
              pGVar10 = (pSVar9->geometries).items[local_8c8].ptr;
              if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar10->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_007133bd;
                local_8f8 = *(undefined4 *)(local_998 + uVar12 * 4);
                uVar7 = *(undefined4 *)(local_988 + uVar12 * 4);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_978 + uVar12 * 4);
                args.context = context->user;
                local_8d8 = *(undefined4 *)((long)&local_a18 + uVar12 * 4);
                local_8e8._4_4_ = uVar7;
                local_8e8._0_4_ = uVar7;
                local_8e8._8_4_ = uVar7;
                local_8e8._12_4_ = uVar7;
                local_928 = *(undefined4 *)(local_968 + uVar12 * 4);
                local_918._4_4_ = *(undefined4 *)(local_958 + uVar12 * 4);
                uVar7 = *(undefined4 *)(local_948 + uVar12 * 4);
                local_908._4_4_ = uVar7;
                local_908._0_4_ = uVar7;
                local_908._8_4_ = uVar7;
                local_908._12_4_ = uVar7;
                uStack_924 = local_928;
                uStack_920 = local_928;
                uStack_91c = local_928;
                local_918._0_4_ = local_918._4_4_;
                local_918._8_4_ = local_918._4_4_;
                local_918._12_4_ = local_918._4_4_;
                uStack_8f4 = local_8f8;
                uStack_8f0 = local_8f8;
                uStack_8ec = local_8f8;
                uStack_8d4 = local_8d8;
                uStack_8d0 = local_8d8;
                uStack_8cc = local_8d8;
                uStack_8c4 = local_8c8;
                uStack_8c0 = local_8c8;
                uStack_8bc = local_8c8;
                local_8b8 = (args.context)->instID[0];
                uStack_8b4 = local_8b8;
                uStack_8b0 = local_8b8;
                uStack_8ac = local_8b8;
                local_8a8 = (args.context)->instPrimID[0];
                uStack_8a4 = local_8a8;
                uStack_8a0 = local_8a8;
                uStack_89c = local_8a8;
                local_b78 = *local_b50;
                args.valid = (int *)local_b78;
                args.geometryUserPtr = pGVar10->userPtr;
                args.hit = (RTCHitN *)&local_928;
                args.N = 4;
                args.ray = (RTCRayN *)ray;
                if (pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  (*pGVar10->occlusionFilterN)(&args);
                }
                if (local_b78 == (undefined1  [16])0x0) {
                  auVar59._8_4_ = 0xffffffff;
                  auVar59._0_8_ = 0xffffffffffffffff;
                  auVar59._12_4_ = 0xffffffff;
                  auVar59 = auVar59 ^ _DAT_01f46b70;
                }
                else {
                  p_Var11 = context->args->filter;
                  if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar10->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    (*p_Var11)(&args);
                  }
                  auVar40._0_4_ = -(uint)(local_b78._0_4_ == 0);
                  auVar40._4_4_ = -(uint)(local_b78._4_4_ == 0);
                  auVar40._8_4_ = -(uint)(local_b78._8_4_ == 0);
                  auVar40._12_4_ = -(uint)(local_b78._12_4_ == 0);
                  auVar59 = auVar40 ^ _DAT_01f46b70;
                  auVar29 = blendvps(_DAT_01f45a40,*(undefined1 (*) [16])(args.ray + 0x80),auVar40);
                  *(undefined1 (*) [16])(args.ray + 0x80) = auVar29;
                }
                if ((_DAT_01f46b40 & auVar59) != (undefined1  [16])0x0) goto LAB_007133bd;
                *(float *)(ray + k * 4 + 0x80) = fVar114;
                lVar20 = local_b58;
              }
              uVar21 = uVar21 ^ 1L << (uVar12 & 0x3f);
            } while (uVar21 != 0);
          }
        }
      }
      local_b58 = lVar20 + 1;
    }
  } while( true );
LAB_007133bd:
  *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
  goto LAB_007133d9;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }